

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::visitRefCast(OptimizeInstructions *this,RefCast *curr)

{
  Expression **ref;
  Type *this_00;
  Type type_;
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  Expression **ppEVar3;
  bool bVar4;
  BasicHeapType BVar5;
  EvaluationResult EVar6;
  Id IVar7;
  Drop *pDVar8;
  Expression *pEVar9;
  Block *pBVar10;
  LocalSet *this_01;
  RefAs *this_02;
  HeapType heapType;
  char cVar11;
  Type *this_03;
  RefAs *rep;
  Type in_R8;
  Drop *local_78;
  RefNull *local_70;
  HeapType local_68;
  Type *local_60;
  Expression **local_58;
  HeapType local_50;
  Type newType;
  Builder local_38;
  Builder builder;
  
  if ((curr->ref->type).id == 1) {
    return;
  }
  ref = &curr->ref;
  this_03 = &(curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type;
  bVar4 = wasm::Type::isNonNullable(this_03);
  if ((bVar4) && (bVar4 = trapOnNull(this,(Expression *)curr,ref), bVar4)) {
    return;
  }
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  local_50 = wasm::Type::getHeapType(this_03);
  BVar5 = HeapType::getBottom(&stack0xffffffffffffffb0);
  local_68.id = (uintptr_t)BVar5;
  local_60 = this_03;
  local_58 = ref;
  do {
    pBVar10 = (Block *)*local_58;
    EVar6 = GCTypeUtils::evaluateCastCheck
                      ((Type)(pBVar10->super_SpecificExpression<(wasm::Expression::Id)1>).
                             super_Expression.type.id,(Type)this_03->id);
    if (EVar6 == SuccessOnlyIfNull) {
      bVar4 = wasm::Type::isNullable(this_03);
      if ((!bVar4) || (bVar4 = wasm::Type::isNullable(&(*ref)->type), !bVar4)) {
        __assert_fail("curr->type.isNullable() && curr->ref->type.isNullable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x7fc,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
      }
      if ((((this->
            super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
            ).super_Pass.runner)->options).trapsNeverHappen == true) {
        pEVar9 = *ref;
        pDVar8 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar8->value = pEVar9;
        Drop::finalize(pDVar8);
        local_78 = pDVar8;
        local_70 = Builder::makeRefNull(&local_38,local_68);
        local_50.id = (uintptr_t)&local_78;
        newType.id = 2;
        pBVar10 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                            (&local_38,
                             (initializer_list<wasm::Expression_*> *)&stack0xffffffffffffffb0,
                             (Type)this_03->id);
      }
      else {
        wasm::Type::Type((Type *)&stack0xffffffffffffffb0,local_68,Nullable);
        if ((Drop **)this_03->id == (Drop **)local_50.id) goto LAB_007feccf;
        (curr->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
             local_50.id;
        pBVar10 = (Block *)curr;
      }
LAB_007feca1:
      replaceCurrent(this,(Expression *)pBVar10);
      cVar11 = '\x01';
    }
    else {
      if (EVar6 == Failure) {
        pEVar9 = *ref;
        pDVar8 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        pDVar8->value = pEVar9;
        Drop::finalize(pDVar8);
        local_78 = pDVar8;
        local_70 = (RefNull *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x10,8);
        (local_70->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression._id =
             UnreachableId;
        (local_70->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id = 1;
        local_50.id = (uintptr_t)&local_78;
        newType.id = 2;
        pBVar10 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                            (&local_38,
                             (initializer_list<wasm::Expression_*> *)&stack0xffffffffffffffb0,
                             (Type)this_03->id);
        goto LAB_007feca1;
      }
      if (EVar6 == Success) {
        this_00 = &(pBVar10->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                   type;
        bVar4 = wasm::Type::isSubType((Type)this_00->id,(Type)this_03->id);
        if (!bVar4) {
          __assert_fail("Type::isSubType(ref->type, curr->type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                        ,0x7d5,"void wasm::OptimizeInstructions::visitRefCast(RefCast *)");
        }
        if (this_03->id != this_00->id) {
          this->refinalize = true;
        }
        if (pBVar10 != (Block *)*ref) {
          bVar4 = wasm::Type::isRef(this_00);
          if (bVar4) {
            local_50 = wasm::Type::getHeapType(this_00);
            bVar4 = HeapType::isBottom(&stack0xffffffffffffffb0);
            if (bVar4) {
              pEVar9 = *ref;
              pDVar8 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
              (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
                   DropId;
              (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id
                   = 0;
              pDVar8->value = pEVar9;
              Drop::finalize(pDVar8);
              pEVar9 = (Expression *)Builder::makeRefNull(&local_38,local_68);
              pBVar10 = Builder::makeBlock(&local_38,(Expression *)pDVar8);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&(pBVar10->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,pEVar9);
              Block::finalize(pBVar10);
              goto LAB_007fee02;
            }
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (pBVar10->super_SpecificExpression<(wasm::Expression::Id)1>).
                         super_Expression.type.id;
          IVar7 = Builder::addVar((Builder *)
                                  (this->
                                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .
                                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                  .currFunction,(Function *)0x0,(Name)(auVar2 << 0x40),in_R8);
          type_.id = (pBVar10->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                     type.id;
          this_01 = (LocalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
          (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id =
               LocalSetId;
          (this_01->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
          this_01->index = IVar7;
          this_01->value = (Expression *)pBVar10;
          LocalSet::makeTee(this_01,type_);
          *local_58 = (Expression *)this_01;
          pEVar9 = *ref;
          pDVar8 = (Drop *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId
          ;
          (pDVar8->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
          pDVar8->value = pEVar9;
          Drop::finalize(pDVar8);
          uVar1 = (pBVar10->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                  .id;
          pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
          pEVar9->_id = LocalGetId;
          pEVar9[1]._id = IVar7;
          (pEVar9->type).id = uVar1;
          pBVar10 = Builder::makeBlock(&local_38,(Expression *)pDVar8);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar10->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar9);
          Block::finalize(pBVar10);
        }
LAB_007fee02:
        replaceCurrent(this,(Expression *)pBVar10);
        cVar11 = '\x01';
        this_03 = local_60;
      }
      else {
LAB_007feccf:
        ppEVar3 = local_58;
        local_58 = Properties::getImmediateFallthroughPtr
                             (local_58,&((this->
                                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                         ).super_Pass.runner)->options,
                              (this->
                              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                              ).
                              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .
                              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                              .currModule,AllowTeeBrIf);
        cVar11 = (local_58 == ppEVar3) * '\x03';
      }
    }
  } while (cVar11 == '\0');
  if (cVar11 != '\x03') {
    return;
  }
  EVar6 = GCTypeUtils::evaluateCastCheck((Type)((*ref)->type).id,(Type)this_03->id);
  rep = (RefAs *)*ref;
  if (EVar6 == SuccessOnlyIfNonNull) {
    this_02 = (RefAs *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id = RefAsId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = 0;
    this_02->op = RefAsNonNull;
    this_02->value = (Expression *)rep;
    RefAs::finalize(this_02);
    rep = this_02;
LAB_007fee95:
    replaceCurrent(this,(Expression *)rep);
    return;
  }
  if (EVar6 == Success) goto LAB_007fee95;
  if ((rep->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id == RefCastId) {
    EVar6 = GCTypeUtils::evaluateCastCheck
                      ((Type)this_03->id,
                       (Type)(rep->super_SpecificExpression<(wasm::Expression::Id)72>).
                             super_Expression.type.id);
    if (EVar6 == SuccessOnlyIfNonNull) {
      pEVar9 = *(Expression **)&rep->op;
      goto LAB_007feee6;
    }
    if (EVar6 == Success) {
      *ref = *(Expression **)&rep->op;
      return;
    }
  }
  pEVar9 = *ref;
  if (pEVar9->_id != RefAsId) {
    return;
  }
  if (pEVar9[1]._id != InvalidId) {
    return;
  }
  pEVar9 = (Expression *)pEVar9[1].type.id;
LAB_007feee6:
  *ref = pEVar9;
  heapType = wasm::Type::getHeapType(this_03);
  wasm::Type::Type((Type *)&stack0xffffffffffffffb0,heapType,NonNullable);
  this_03->id = local_50.id;
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    // Note we must check the ref's type here and not our own, since we only
    // refinalize at the end, which means our type may not have been updated yet
    // after a change in the child.
    // TODO: we could update unreachability up the stack perhaps, or just move
    //       all patterns that can add unreachability to a pass that does so
    //       already like vacuum or dce.
    if (curr->ref->type == Type::unreachable) {
      return;
    }

    if (curr->type.isNonNullable() && trapOnNull(curr, curr->ref)) {
      return;
    }

    // Check whether the cast will definitely fail (or succeed). Look not just
    // at the fallthrough but all intermediatary fallthrough values as well, as
    // if any of them has a type that cannot be cast to us, then we will trap,
    // e.g.
    //
    //   (ref.cast $struct-A
    //     (ref.cast $struct-B
    //       (ref.cast $array
    //         (local.get $x)
    //
    // The fallthrough is the local.get, but the array cast in the middle
    // proves a trap must happen.
    Builder builder(*getModule());
    auto nullType = curr->type.getHeapType().getBottom();
    {
      auto** refp = &curr->ref;
      while (1) {
        auto* ref = *refp;

        auto result = GCTypeUtils::evaluateCastCheck(ref->type, curr->type);

        if (result == GCTypeUtils::Success) {
          // The cast will succeed. This can only happen if the ref is a subtype
          // of the cast instruction, which means we can replace the cast with
          // the ref.
          assert(Type::isSubType(ref->type, curr->type));
          if (curr->type != ref->type) {
            refinalize = true;
          }
          // If there were no intermediate expressions, we can just skip the
          // cast.
          if (ref == curr->ref) {
            replaceCurrent(ref);
            return;
          }
          // Otherwise we can't just remove the cast and replace it with `ref`
          // because the intermediate expressions might have had side effects.
          // We can replace the cast with a drop followed by a direct return of
          // the value, though.
          if (ref->type.isNull()) {
            // We can materialize the resulting null value directly.
            replaceCurrent(builder.makeSequence(builder.makeDrop(curr->ref),
                                                builder.makeRefNull(nullType)));
            return;
          }
          // We need to use a tee to return the value since we can't materialize
          // it directly.
          auto scratch = builder.addVar(getFunction(), ref->type);
          *refp = builder.makeLocalTee(scratch, ref, ref->type);
          replaceCurrent(
            builder.makeSequence(builder.makeDrop(curr->ref),
                                 builder.makeLocalGet(scratch, ref->type)));
          return;
        } else if (result == GCTypeUtils::Failure) {
          // This cast cannot succeed, so it will trap.
          // Make sure to emit a block with the same type as us; leave updating
          // types for other passes.
          replaceCurrent(builder.makeBlock(
            {builder.makeDrop(curr->ref), builder.makeUnreachable()},
            curr->type));
          return;
        } else if (result == GCTypeUtils::SuccessOnlyIfNull) {
          // If either cast or ref types were non-nullable then the cast could
          // never succeed, and we'd have reached |Failure|, above.
          assert(curr->type.isNullable() && curr->ref->type.isNullable());

          // The cast either returns null, or traps. In trapsNeverHappen mode
          // we know the result, since it by assumption will not trap.
          if (getPassOptions().trapsNeverHappen) {
            replaceCurrent(builder.makeBlock(
              {builder.makeDrop(curr->ref), builder.makeRefNull(nullType)},
              curr->type));
            return;
          }

          // Without trapsNeverHappen we can at least sharpen the type here, if
          // it is not already a null type.
          auto newType = Type(nullType, Nullable);
          if (curr->type != newType) {
            curr->type = newType;
            // Call replaceCurrent() to make us re-optimize this node, as we
            // may have just unlocked further opportunities. (We could just
            // continue down to the rest, but we'd need to do more work to
            // make sure all the local state in this function is in sync
            // which this change; it's easier to just do another clean pass
            // on this node.)
            replaceCurrent(curr);
            return;
          }
        }

        auto** last = refp;
        refp = Properties::getImmediateFallthroughPtr(
          refp, getPassOptions(), *getModule());
        if (refp == last) {
          break;
        }
      }
    }

    // See what we know about the cast result.
    //
    // Note that we could look at the fallthrough for the ref, but that would
    // require additional work to make sure we emit something that validates
    // properly. TODO
    auto result = GCTypeUtils::evaluateCastCheck(curr->ref->type, curr->type);

    if (result == GCTypeUtils::Success) {
      replaceCurrent(curr->ref);
      return;
    } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
      // All we need to do is check for a null here.
      //
      // As above, we must refinalize as we may now be emitting a more refined
      // type (specifically a more refined heap type).
      replaceCurrent(builder.makeRefAs(RefAsNonNull, curr->ref));
      return;
    }

    if (auto* child = curr->ref->dynCast<RefCast>()) {
      // Repeated casts can be removed, leaving just the most demanding of
      // them. Note that earlier we already checked for the cast of the ref's
      // type being more refined, so all we need to handle is the opposite, that
      // is, something like this:
      //
      //   (ref.cast $B
      //     (ref.cast $A
      //
      // where $B is a subtype of $A. We don't need to cast to $A here; we can
      // just cast all the way to $B immediately. To check this, see if the
      // parent's type would succeed if cast by the child's; if it must then the
      // child's is redundant.
      auto result = GCTypeUtils::evaluateCastCheck(curr->type, child->type);
      if (result == GCTypeUtils::Success) {
        curr->ref = child->ref;
        return;
      } else if (result == GCTypeUtils::SuccessOnlyIfNonNull) {
        // Similar to above, but we must also trap on null.
        curr->ref = child->ref;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
        return;
      }
    }

    // ref.cast can be combined with ref.as_non_null,
    //
    //   (ref.cast null (ref.as_non_null ..))
    // =>
    //   (ref.cast ..)
    //
    if (auto* as = curr->ref->dynCast<RefAs>()) {
      if (as->op == RefAsNonNull) {
        curr->ref = as->value;
        curr->type = Type(curr->type.getHeapType(), NonNullable);
      }
    }
  }